

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * Kvm::numberToString(Kvm *vm,Value *args)

{
  _func_int **pp_Var1;
  bool bVar2;
  uint uVar3;
  Value *pVVar4;
  uint __len;
  ulong uVar5;
  ulong __val;
  string __str;
  string local_50;
  
  pp_Var1 = args[1]._vptr_Value;
  uVar5 = (long)pp_Var1 >> 1;
  __val = -uVar5;
  if (0 < (long)uVar5) {
    __val = uVar5;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0010955a;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0010955a;
      }
      if (uVar5 < 10000) goto LAB_0010955a;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_0010955a:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((long)pp_Var1 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p + -((long)pp_Var1 >> 0x3f),__len,__val);
  pVVar4 = makeString(vm,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return pVVar4;
}

Assistant:

const Value* Kvm::numberToString(Kvm *vm, const Value *args)
{
    long n = TK_INT(car(args));
    return vm->makeString(std::to_string(n));
}